

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void nth_valueStepFunc(sqlite3_context *pCtx,int nArg,sqlite3_value **apArg)

{
  int iVar1;
  long *plVar2;
  sqlite3_value *psVar3;
  double fVal;
  i64 iVal;
  NthValueCtx *p;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  sqlite3_value *in_stack_ffffffffffffffd0;
  long local_28;
  
  plVar2 = (long *)sqlite3_aggregate_context
                             ((sqlite3_context *)
                              CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),0);
  if (plVar2 == (long *)0x0) {
    return;
  }
  iVar1 = sqlite3_value_numeric_type(in_stack_ffffffffffffffd0);
  if (iVar1 == 1) {
    local_28 = sqlite3_value_int64((sqlite3_value *)0x22aec8);
  }
  else {
    if (iVar1 != 2) goto LAB_0022af6a;
    in_stack_ffffffffffffffd0 = (sqlite3_value *)sqlite3_value_double((sqlite3_value *)0x22aedd);
    if (((double)(long)(double)in_stack_ffffffffffffffd0 != (double)in_stack_ffffffffffffffd0) ||
       (NAN((double)(long)(double)in_stack_ffffffffffffffd0) ||
        NAN((double)in_stack_ffffffffffffffd0))) goto LAB_0022af6a;
    local_28 = (long)(double)in_stack_ffffffffffffffd0;
  }
  if (0 < local_28) {
    *plVar2 = *plVar2 + 1;
    if (local_28 != *plVar2) {
      return;
    }
    psVar3 = sqlite3_value_dup((sqlite3_value *)CONCAT44(iVar1,in_stack_ffffffffffffffc8));
    plVar2[1] = (long)psVar3;
    if (plVar2[1] != 0) {
      return;
    }
    sqlite3_result_error_nomem((sqlite3_context *)0x22af64);
    return;
  }
LAB_0022af6a:
  sqlite3_result_error
            ((sqlite3_context *)in_stack_ffffffffffffffd0,
             (char *)CONCAT44(iVar1,in_stack_ffffffffffffffc8),0);
  return;
}

Assistant:

static void nth_valueStepFunc(
  sqlite3_context *pCtx,
  int nArg,
  sqlite3_value **apArg
){
  struct NthValueCtx *p;
  p = (struct NthValueCtx*)sqlite3_aggregate_context(pCtx, sizeof(*p));
  if( p ){
    i64 iVal;
    switch( sqlite3_value_numeric_type(apArg[1]) ){
      case SQLITE_INTEGER:
        iVal = sqlite3_value_int64(apArg[1]);
        break;
      case SQLITE_FLOAT: {
        double fVal = sqlite3_value_double(apArg[1]);
        if( ((i64)fVal)!=fVal ) goto error_out;
        iVal = (i64)fVal;
        break;
      }
      default:
        goto error_out;
    }
    if( iVal<=0 ) goto error_out;

    p->nStep++;
    if( iVal==p->nStep ){
      p->pValue = sqlite3_value_dup(apArg[0]);
      if( !p->pValue ){
        sqlite3_result_error_nomem(pCtx);
      }
    }
  }
  UNUSED_PARAMETER(nArg);
  UNUSED_PARAMETER(apArg);
  return;

 error_out:
  sqlite3_result_error(
      pCtx, "second argument to nth_value must be a positive integer", -1
  );
}